

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.cc
# Opt level: O2

void __thiscall fasttext::QMatrix::quantize(QMatrix *this,Matrix *matrix)

{
  uint __line;
  char *__assertion;
  Vector norms;
  Matrix temp;
  
  if (this->m_ == matrix->m_) {
    if (this->n_ == matrix->n_) {
      Matrix::Matrix(&temp,matrix);
      if (this->qnorm_ == true) {
        Vector::Vector(&norms,temp.m_);
        Matrix::l2NormRow(&temp,&norms);
        Matrix::divideRow(&temp,&norms,0,-1);
        quantizeNorm(this,&norms);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&norms);
      }
      ProductQuantizer::train
                ((this->pq_)._M_t.
                 super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
                 .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,
                 (int32_t)this->m_,
                 temp.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
      ProductQuantizer::compute_codes
                ((this->pq_)._M_t.
                 super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
                 .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,
                 temp.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,(int32_t)this->m_);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&temp);
      return;
    }
    __assertion = "n_ == matrix.size(1)";
    __line = 0x2a;
  }
  else {
    __assertion = "m_ == matrix.size(0)";
    __line = 0x29;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Lizhen0909[P]LSHVec/src/qmatrix.cc"
                ,__line,"void fasttext::QMatrix::quantize(const Matrix &)");
}

Assistant:

void QMatrix::quantize(const Matrix& matrix) {
  assert(m_ == matrix.size(0));
  assert(n_ == matrix.size(1));
  Matrix temp(matrix);
  if (qnorm_) {
    Vector norms(temp.size(0));
    temp.l2NormRow(norms);
    temp.divideRow(norms);
    quantizeNorm(norms);
  }
  auto dataptr = temp.data();
  pq_->train(m_, dataptr);
  pq_->compute_codes(dataptr, codes_.data(), m_);
}